

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall
mocker::SemanticChecker::collectSymbols::Collect::operator()(Collect *this,ClassDecl *decl)

{
  element_type *peVar1;
  bool bVar2;
  DuplicatedSymbols *this_00;
  mapped_type *pos;
  SymTbl *this_01;
  __shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  shared_ptr<mocker::ast::ASTNode> local_58;
  shared_ptr<mocker::ast::Declaration> local_48;
  
  this_01 = &this->ctx->syms;
  SymTbl::global(this_01);
  peVar1 = (decl->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::ASTNode,void>
            (local_80,(__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
                      &(decl->super_Declaration).super_ASTNode.
                       super_enable_shared_from_this<mocker::ast::ASTNode>);
  std::static_pointer_cast<mocker::ast::ClassDecl,mocker::ast::ASTNode>(&local_58);
  local_48.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_58.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_58.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  local_58.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = SymTbl::addSymbol(this_01,(ScopeID *)&local_70,&peVar1->val,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  if (bVar2) {
    return;
  }
  this_00 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
  local_70._M_impl.super__Vector_impl_data._M_start = (pointer)decl;
  pos = std::__detail::
        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)this->pos,(key_type *)&local_70);
  DuplicatedSymbols::DuplicatedSymbols
            (this_00,pos,
             &((decl->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->val)
  ;
  __cxa_throw(this_00,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
}

Assistant:

void operator()(ast::ClassDecl &decl) const override {
      auto res = ctx.syms.addSymbol(
          ctx.syms.global(), decl.identifier->val,
          std::static_pointer_cast<ast::ClassDecl>(decl.shared_from_this()));
      if (!res)
        throw DuplicatedSymbols(pos.at(decl.getID()), decl.identifier->val);
    }